

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O0

void __thiscall
IGNORETestRegistry_shuffleTestList_Test::testBody(IGNORETestRegistry_shuffleTestList_Test *this)

{
  TestRegistry *pTVar1;
  MockTest *pMVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UtestShell *pUVar6;
  TestTerminator *pTVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  UtestShell *third_after;
  UtestShell *second_after;
  UtestShell *first_after;
  UtestShell *third_before;
  UtestShell *second_before;
  UtestShell *first_before;
  IGNORETestRegistry_shuffleTestList_Test *this_local;
  
  CppUTestStore(&PlatformSpecificRand);
  PlatformSpecificRand = getZero;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1);
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x13])();
  iVar4 = (*(((MockTest *)CONCAT44(extraout_var,iVar3))->super_UtestShell)._vptr_UtestShell[3])();
  iVar5 = (*(((MockTest *)CONCAT44(extraout_var_00,iVar4))->super_UtestShell)._vptr_UtestShell[3])()
  ;
  pUVar6 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)((MockTest *)CONCAT44(extraout_var,iVar3) == pMVar2),"CHECK_TRUE",
             "first_before == test1",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1a1,pTVar7);
  pUVar6 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)((MockTest *)CONCAT44(extraout_var_00,iVar4) == pMVar2),"CHECK_TRUE",
             "second_before == test2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1a2,pTVar7);
  pUVar6 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)((MockTest *)CONCAT44(extraout_var_01,iVar5) == pMVar2),"CHECK_TRUE",
             "third_before == test3",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1a3,pTVar7);
  pUVar6 = UtestShell::getCurrent();
  iVar3 = (*(((MockTest *)CONCAT44(extraout_var_01,iVar5))->super_UtestShell)._vptr_UtestShell[3])()
  ;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)(CONCAT44(extraout_var_02,iVar3) == 0),"CHECK_TRUE",
             "third_before->getNext() == NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1a4,pTVar7);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[6])(pTVar1,0);
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x13])();
  iVar4 = (*(((MockTest *)CONCAT44(extraout_var_03,iVar3))->super_UtestShell)._vptr_UtestShell[3])()
  ;
  iVar5 = (*(((MockTest *)CONCAT44(extraout_var_04,iVar4))->super_UtestShell)._vptr_UtestShell[3])()
  ;
  pUVar6 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)((MockTest *)CONCAT44(extraout_var_03,iVar3) == pMVar2),"CHECK_TRUE",
             "first_after == test2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1ad,pTVar7);
  pUVar6 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)((MockTest *)CONCAT44(extraout_var_04,iVar4) == pMVar2),"CHECK_TRUE",
             "second_after == test3",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1ae,pTVar7);
  pUVar6 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)((MockTest *)CONCAT44(extraout_var_05,iVar5) == pMVar2),"CHECK_TRUE",
             "third_after == test1",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1af,pTVar7);
  pUVar6 = UtestShell::getCurrent();
  iVar3 = (*(((MockTest *)CONCAT44(extraout_var_05,iVar5))->super_UtestShell)._vptr_UtestShell[3])()
  ;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)(CONCAT44(extraout_var_06,iVar3) == 0),"CHECK_TRUE",
             "third_after->getNext() == NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1b0,pTVar7);
  return;
}

Assistant:

IGNORE_TEST(TestRegistry, shuffleTestList)
{
    UT_PTR_SET(PlatformSpecificRand, getZero);
    myRegistry->addTest(test3);
    myRegistry->addTest(test2);
    myRegistry->addTest(test1);

    UtestShell* first_before  = myRegistry->getFirstTest();
    UtestShell* second_before = first_before->getNext();
    UtestShell* third_before  = second_before->getNext();

    CHECK_TRUE(first_before  == test1);
    CHECK_TRUE(second_before == test2);
    CHECK_TRUE(third_before  == test3);
    CHECK_TRUE(third_before->getNext()  == NULLPTR);

    // shuffle always with element at index 0: [1] 2 [3] --> [3] [2] 1 --> 2 3 1
    myRegistry->shuffleTests(0);

    UtestShell* first_after  = myRegistry->getFirstTest();
    UtestShell* second_after = first_after->getNext();
    UtestShell* third_after  = second_after->getNext();

    CHECK_TRUE(first_after  == test2);
    CHECK_TRUE(second_after == test3);
    CHECK_TRUE(third_after  == test1);
    CHECK_TRUE(third_after->getNext() == NULLPTR);
}